

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

string * to_str_abi_cxx11_(string *__return_storage_ptr__,uint32_t c)

{
  size_type *psVar1;
  undefined8 *puVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  to_str_abi_cxx11_((string *)&local_38,(uint16_t)(c >> 0x10));
  to_str_abi_cxx11_((string *)local_58,(uint16_t)c);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_allocated_capacity != &local_28) {
    uVar4 = local_28._M_allocated_capacity;
  }
  if ((ulong)uVar4 < (ulong)(local_58._8_8_ + local_38._8_8_)) {
    uVar5 = 0xf;
    if ((string *)local_58._0_8_ != (string *)(local_58 + 0x10)) {
      uVar5 = local_58._16_8_;
    }
    if ((ulong)(local_58._8_8_ + local_38._8_8_) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_58,0,(char *)0x0,local_38._M_allocated_capacity);
      goto LAB_0023f787;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append(local_38._M_local_buf,local_58._0_8_);
LAB_0023f787:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  psVar3 = (string *)(local_58 + 0x10);
  if ((string *)local_58._0_8_ != psVar3) {
    operator_delete((void *)local_58._0_8_);
    psVar3 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_allocated_capacity != &local_28) {
    operator_delete((void *)local_38._M_allocated_capacity);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

static std::string to_str(uint32_t c)
{ return to_str(uint16_t((0xFFFF0000 & c) >> 16)) + to_str(uint16_t(c)); }